

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall
fasttext::Dictionary::getSubwords
          (Dictionary *this,string *word,vector<int,_std::allocator<int>_> *ngrams,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *substrings)

{
  bool bVar1;
  value_type *in_RCX;
  Dictionary *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  string *in_stack_00000018;
  Dictionary *in_stack_00000020;
  int32_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_48 [36];
  int32_t local_24;
  value_type *local_20;
  
  local_20 = in_RCX;
  local_24 = getId(in_RDI,in_stack_ffffffffffffff78);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x19a43f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x19a449);
  if (-1 < local_24) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_RDI,
               (value_type_conflict *)in_stack_ffffffffffffff78);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
              (&in_RDI->words_,(long)local_24);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_RDI,local_20);
    in_stack_ffffffffffffff78 = local_20;
  }
  bVar1 = std::operator!=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (bVar1) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffff98;
    std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::operator+(in_stack_ffffffffffffff78,__rhs);
    computeSubwords(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  }
  return;
}

Assistant:

void Dictionary::getSubwords(
    const std::string& word,
    std::vector<int32_t>& ngrams,
    std::vector<std::string>& substrings) const {
  int32_t i = getId(word);
  ngrams.clear();
  substrings.clear();
  if (i >= 0) {
    ngrams.push_back(i);
    substrings.push_back(words_[i].word);
  }
  if (word != EOS) {
    computeSubwords(BOW + word + EOW, ngrams, &substrings);
  }
}